

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Indexer.cpp
# Opt level: O1

vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> * __thiscall
Indexer::finalize(vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                  *__return_storage_ptr__,Indexer *this)

{
  if ((this->flat_builder).fids.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->flat_builder).fids.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    make_spill(this,&this->flat_builder);
  }
  if ((this->bitmap_builder).fids.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->bitmap_builder).fids.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    make_spill(this,&this->bitmap_builder);
  }
  created_dataset_ptrs(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

std::vector<const OnDiskDataset *> Indexer::finalize() {
    if (!flat_builder.empty()) {
        make_spill(flat_builder);
    }

    if (!bitmap_builder.empty()) {
        make_spill(bitmap_builder);
    }

    return created_dataset_ptrs();
}